

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

Amount __thiscall cfd::TransactionContext::GetFeeAmount(TransactionContext *this)

{
  bool bVar1;
  uint32_t vout;
  undefined8 uVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined8 extraout_RDX;
  long in_RDI;
  Amount AVar5;
  Amount result;
  TxOut *txout_ref;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *__range1_1;
  Amount output;
  OutPoint outpoint;
  TxIn *txin_ref;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range1;
  UtxoData utxo;
  Amount input;
  undefined7 in_stack_fffffffffffff950;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  undefined8 in_stack_fffffffffffff968;
  CfdError error_code;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  UtxoData *in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9c1;
  TransactionContext *in_stack_fffffffffffff9c8;
  undefined7 uStack_62f;
  Amount local_608;
  AbstractTxOut *local_5f8;
  __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
  local_5f0;
  __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
  local_5e8;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_5e0;
  Amount local_5d8;
  int64_t local_5c8;
  undefined1 local_5c0;
  undefined1 local_5b2;
  allocator local_5b1;
  string local_5b0 [48];
  Txid local_580;
  OutPoint local_560;
  AbstractTxIn *local_538;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_530;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_528;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *local_520;
  Amount local_2c0 [41];
  Amount local_28;
  Amount local_10;
  
  core::Amount::Amount(&local_28);
  UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  local_520 = (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RDI + 0x10);
  local_528._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin(local_520);
  local_530._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end(local_520);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_528,&local_530);
    if (!bVar1) {
      core::Amount::Amount(&local_5d8);
      local_5e0 = (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)(in_RDI + 0x28);
      local_5e8._M_current =
           (TxOut *)std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::begin
                              (local_5e0);
      local_5f0._M_current =
           (TxOut *)std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::end(local_5e0)
      ;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&local_5e8,&local_5f0);
        if (!bVar1) break;
        local_5f8 = &__gnu_cxx::
                     __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
                     ::operator*(&local_5e8)->super_AbstractTxOut;
        AVar5 = core::AbstractTxOut::GetValue(local_5f8);
        local_608.amount_ = AVar5.amount_;
        local_608.ignore_check_ = AVar5.ignore_check_;
        core::Amount::operator+=(&local_5d8,&local_608);
        __gnu_cxx::
        __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
        ::operator++(&local_5e8);
      }
      AVar5 = core::operator-(&local_28,&local_5d8);
      iVar3 = AVar5.amount_;
      uVar6 = AVar5.ignore_check_;
      iVar4 = core::Amount::GetSatoshiValue((Amount *)&stack0xfffffffffffff9c8);
      if (iVar4 < 0) {
        core::Amount::Amount(&local_10);
      }
      else {
        local_10._9_7_ = uStack_62f;
        local_10.ignore_check_ = AVar5.ignore_check_;
        local_10.amount_ = iVar3;
      }
      UtxoData::~UtxoData((UtxoData *)CONCAT17(uVar6,in_stack_fffffffffffff950));
      AVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      AVar5.ignore_check_ = local_10.ignore_check_;
      AVar5.amount_ = local_10.amount_;
      return AVar5;
    }
    local_538 = &__gnu_cxx::
                 __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                 ::operator*(&local_528)->super_AbstractTxIn;
    core::AbstractTxIn::GetTxid(&local_580,local_538);
    vout = core::AbstractTxIn::GetVout(local_538);
    core::OutPoint::OutPoint(&local_560,&local_580,vout);
    core::Txid::~Txid((Txid *)0x50d506);
    bVar1 = IsFindUtxoMap(in_stack_fffffffffffff9c8,
                          (OutPoint *)CONCAT71(in_stack_fffffffffffff9c1,in_stack_fffffffffffff9c0),
                          in_stack_fffffffffffff9b8);
    error_code = (CfdError)((ulong)in_stack_fffffffffffff968 >> 0x20);
    if (!bVar1) break;
    AVar5 = core::Amount::operator+=(&local_28,local_2c0);
    local_5c8 = AVar5.amount_;
    local_5c0 = AVar5.ignore_check_;
    core::OutPoint::~OutPoint((OutPoint *)0x50d6af);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&local_528);
  }
  local_5b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"Utxo is not found. GetFeeAmount fail.",&local_5b1);
  core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
             error_code,(string *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
  local_5b2 = 0;
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Amount TransactionContext::GetFeeAmount() const {
  Amount input;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. GetFeeAmount fail.");
    }
    input += utxo.amount;
  }

  Amount output;
  for (const auto& txout_ref : vout_) {
    output += txout_ref.GetValue();
  }
  Amount result = input - output;
  if (result.GetSatoshiValue() < 0) {
    return Amount();
  }
  return result;
}